

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

Abc_Frame_t * Abc_FrameAllocate(void)

{
  Abc_Frame_t *pAbc;
  char *pcVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Int_t *pVVar3;
  Abc_Frame_t *p;
  
  pAbc = (Abc_Frame_t *)calloc(1,0x290);
  pcVar1 = Abc_UtilsGetVersion(pAbc);
  pAbc->sVersion = pcVar1;
  pAbc->Err = _stderr;
  pAbc->Out = _stdout;
  pAbc->Hst = (FILE *)0x0;
  pAbc->Status = -1;
  pAbc->nFrames = -1;
  pAbc->nSteps = 1;
  pAbc->fBatchMode = 0;
  pVVar2 = Vec_PtrAlloc(0x10);
  pAbc->vStore = pVVar2;
  pVVar3 = Vec_IntAlloc(0);
  pAbc->vAbcObjIds = pVVar3;
  pVVar2 = Vec_PtrAlloc(100);
  pAbc->vPlugInComBinPairs = pVVar2;
  return pAbc;
}

Assistant:

Abc_Frame_t * Abc_FrameAllocate()
{
    Abc_Frame_t * p;
    extern void define_cube_size( int n );
    extern void set_espresso_flags();
    // allocate and clean
    p = ABC_CALLOC( Abc_Frame_t, 1 );
    // get version
    p->sVersion = Abc_UtilsGetVersion( p );
    // set streams
    p->Err = stderr;
    p->Out = stdout;
    p->Hst = NULL;
    p->Status     = -1;
    p->nFrames    = -1;
    // set the starting step
    p->nSteps     =  1;
    p->fBatchMode =  0;
    // networks to be used by choice
    p->vStore = Vec_PtrAlloc( 16 );
    p->vAbcObjIds = Vec_IntAlloc( 0 );
    // initialize decomposition manager
//    define_cube_size(20);
//    set_espresso_flags();
    // initialize the trace manager
//    Abc_HManStart();
    p->vPlugInComBinPairs = Vec_PtrAlloc( 100 );
    return p;
}